

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlParserAddNodeInfo(xmlParserCtxtPtr ctxt,xmlParserNodeInfoPtr info)

{
  size_t sVar1;
  unsigned_long uVar2;
  ulong local_38;
  unsigned_long i;
  xmlParserNodeInfo *pxStack_28;
  uint byte_size;
  xmlParserNodeInfo *tmp_buffer;
  unsigned_long pos;
  xmlParserNodeInfoPtr info_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (info != (xmlParserNodeInfoPtr)0x0)) {
    uVar2 = xmlParserFindNodeInfoIndex(&ctxt->node_seq,info->node);
    if ((uVar2 < (ctxt->node_seq).length) &&
       (((ctxt->node_seq).buffer != (xmlParserNodeInfo *)0x0 &&
        ((ctxt->node_seq).buffer[uVar2].node == info->node)))) {
      memcpy((ctxt->node_seq).buffer + uVar2,info,0x28);
    }
    else {
      if (((ctxt->node_seq).maximum < (ctxt->node_seq).length + 1) ||
         ((ctxt->node_seq).buffer == (xmlParserNodeInfo *)0x0)) {
        if ((ctxt->node_seq).maximum == 0) {
          (ctxt->node_seq).maximum = 2;
        }
        sVar1 = (unsigned_long)(ctxt->node_seq).maximum * 0x50;
        if ((ctxt->node_seq).buffer == (xmlParserNodeInfo *)0x0) {
          pxStack_28 = (xmlParserNodeInfo *)(*xmlMalloc)(sVar1);
        }
        else {
          pxStack_28 = (xmlParserNodeInfo *)(*xmlRealloc)((ctxt->node_seq).buffer,sVar1);
        }
        if (pxStack_28 == (xmlParserNodeInfo *)0x0) {
          xmlErrMemory(ctxt,"failed to allocate buffer\n");
          return;
        }
        (ctxt->node_seq).buffer = pxStack_28;
        (ctxt->node_seq).maximum = (ctxt->node_seq).maximum << 1;
      }
      if (uVar2 != (ctxt->node_seq).length) {
        for (local_38 = (ctxt->node_seq).length; uVar2 < local_38; local_38 = local_38 - 1) {
          memcpy((ctxt->node_seq).buffer + local_38,(ctxt->node_seq).buffer + (local_38 - 1),0x28);
        }
      }
      memcpy((ctxt->node_seq).buffer + uVar2,info,0x28);
      (ctxt->node_seq).length = (ctxt->node_seq).length + 1;
    }
  }
  return;
}

Assistant:

void
xmlParserAddNodeInfo(xmlParserCtxtPtr ctxt,
                     const xmlParserNodeInfoPtr info)
{
    unsigned long pos;

    if ((ctxt == NULL) || (info == NULL)) return;

    /* Find pos and check to see if node is already in the sequence */
    pos = xmlParserFindNodeInfoIndex(&ctxt->node_seq, (xmlNodePtr)
                                     info->node);

    if ((pos < ctxt->node_seq.length) &&
        (ctxt->node_seq.buffer != NULL) &&
        (ctxt->node_seq.buffer[pos].node == info->node)) {
        ctxt->node_seq.buffer[pos] = *info;
    }

    /* Otherwise, we need to add new node to buffer */
    else {
        if ((ctxt->node_seq.length + 1 > ctxt->node_seq.maximum) ||
	    (ctxt->node_seq.buffer == NULL)) {
            xmlParserNodeInfo *tmp_buffer;
            unsigned int byte_size;

            if (ctxt->node_seq.maximum == 0)
                ctxt->node_seq.maximum = 2;
            byte_size = (sizeof(*ctxt->node_seq.buffer) *
			(2 * ctxt->node_seq.maximum));

            if (ctxt->node_seq.buffer == NULL)
                tmp_buffer = (xmlParserNodeInfo *) xmlMalloc(byte_size);
            else
                tmp_buffer =
                    (xmlParserNodeInfo *) xmlRealloc(ctxt->node_seq.buffer,
                                                     byte_size);

            if (tmp_buffer == NULL) {
		xmlErrMemory(ctxt, "failed to allocate buffer\n");
                return;
            }
            ctxt->node_seq.buffer = tmp_buffer;
            ctxt->node_seq.maximum *= 2;
        }

        /* If position is not at end, move elements out of the way */
        if (pos != ctxt->node_seq.length) {
            unsigned long i;

            for (i = ctxt->node_seq.length; i > pos; i--)
                ctxt->node_seq.buffer[i] = ctxt->node_seq.buffer[i - 1];
        }

        /* Copy element and increase length */
        ctxt->node_seq.buffer[pos] = *info;
        ctxt->node_seq.length++;
    }
}